

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::MLsyncProject
          (Projection *this,int c_lev,MultiFab *pres_crse,MultiFab *vel_crse,MultiFab *cc_rhs_crse,
          MultiFab *pres_fine,MultiFab *vel_fine,MultiFab *cc_rhs_fine,MultiFab *rho_crse,
          MultiFab *rho_fine,MultiFab *Vsync,MultiFab *V_corr,MultiFab *phi_fine,
          SyncRegister *rhs_sync_reg,SyncRegister *crsr_sync_reg,Real dt_crse,IntVect *ratio,
          int crse_iteration,int crse_dt_ratio,Geometry *crse_geom)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  BoxArray *bxs_00;
  int *piVar1;
  ulong uVar2;
  pointer pGVar3;
  ulong uVar4;
  undefined8 uVar5;
  pointer puVar6;
  bool bVar7;
  int i;
  int level;
  int iVar8;
  ostream *poVar9;
  MultiFab *pMVar10;
  long lVar11;
  NavierStokesBase *this_00;
  byte bVar12;
  BCRec *phys_bc;
  Geometry *crse_geom_00;
  byte bVar14;
  undefined4 uVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  double dVar16;
  int iVar18;
  double dVar17;
  undefined1 auVar19 [16];
  FabArray<amrex::FArrayBox> *local_430;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  phi;
  Box bx;
  FabFactory<amrex::FArrayBox> local_3b0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> sig;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhcc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhnd_vec;
  BoxArray sync_boxes;
  MultiFab rhnd;
  MultiFab *pMVar13;
  
  if (verbose != 0) {
    poVar9 = amrex::OutStream();
    amrex::Print::Print((Print *)&sync_boxes,poVar9);
    poVar9 = (ostream *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1);
    std::operator<<(poVar9,"Projection::MLsyncProject(): levels = ");
    std::ostream::operator<<(poVar9,c_lev);
    std::operator<<(poVar9,", ");
    std::ostream::operator<<(poVar9,c_lev + 1);
    std::operator<<(poVar9,'\n');
    amrex::Print::~Print((Print *)&sync_boxes);
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
  }
  dVar16 = amrex::ParallelDescriptor::second();
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&phi.
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,10,(allocator_type *)&sync_boxes);
  puVar6 = phi.
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar10 = (MultiFab *)operator_new(0x180);
  bxs = &(pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (pMVar10,bxs,dm,1,1,(MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[c_lev]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  pMVar13 = puVar6[c_lev]._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  puVar6[c_lev]._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar10;
  if (pMVar13 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar13->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&(phi.
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[c_lev]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>,0.0);
  puVar6 = phi.
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar10 = (MultiFab *)operator_new(0x180);
  bxs_00 = &(pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  level = c_lev + 1;
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (pMVar10,bxs_00,
             &(pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,1,
             (MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[level]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  pMVar13 = puVar6[level]._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  puVar6[level]._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar10;
  if (pMVar13 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar13->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&(phi.
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
              super_FabArray<amrex::FArrayBox>,0.0);
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&rhnd,bxs,dm,1,0,(MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[c_lev]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  phys_bc = this->phys_bc;
  SyncRegister::InitRHS(rhs_sync_reg,&rhnd,crse_geom,phys_bc);
  bx.smallend.vect._0_8_ = *(undefined8 *)(crse_geom->domain).smallend.vect;
  uVar5 = *(undefined8 *)((crse_geom->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(crse_geom->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((crse_geom->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar5;
  bx.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    phys_bc = (BCRec *)(ulong)bx.btype.itype;
    if ((bx.btype.itype >> ((uint)lVar11 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar11;
      *piVar1 = *piVar1 + 1;
    }
  }
  uVar2 = *(ulong *)(ratio->vect + 1);
  iVar8 = (int)uVar2;
  iVar18 = (int)(uVar2 >> 0x20);
  auVar19._0_4_ = -(uint)(iVar8 == 1);
  auVar19._4_4_ = -(uint)(iVar8 == 1);
  auVar19._8_4_ = -(uint)(iVar18 == 1);
  auVar19._12_4_ = -(uint)(iVar18 == 1);
  uVar15 = movmskpd((int)ratio,auVar19);
  bVar14 = (byte)uVar15 ^ 3;
  bVar12 = ratio->vect[0] != 1U | bVar14;
  pMVar13 = (MultiFab *)CONCAT71((int7)((ulong)phys_bc >> 8),bVar12);
  if (((bVar14 >> 1 | bVar12) & 1) != 0) {
    bx.bigend.vect[1] = iVar8 * bx.bigend.vect[1];
    pMVar13 = (MultiFab *)(ulong)(uint)bx.bigend.vect[1];
    bx.bigend.vect[2] = iVar18 * bx.bigend.vect[2];
    uVar4 = bx.smallend.vect._0_8_ & 0xffffffff;
    bx.smallend.vect[1] = (int)(((ulong)bx.smallend.vect._0_8_ >> 0x20) * (uVar2 & 0xffffffff));
    bx.smallend.vect[0] = (int)((uint)ratio->vect[0] * uVar4);
  }
  bx.btype.itype = 7;
  amrex::BoxArray::operator[]((Box *)&sync_boxes,bxs_00,0);
  bVar7 = amrex::Box::operator==((Box *)&sync_boxes,&bx);
  iVar8 = extraout_EDX;
  if (bVar7) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&rhnd.super_FabArray<amrex::FArrayBox>,0.0);
    iVar8 = extraout_EDX_00;
  }
  scaleVar(this,rho_crse,iVar8,pMVar13,c_lev);
  scaleVar(this,rho_fine,extraout_EDX_01,pMVar13,level);
  sync_boxes.m_bat._0_8_ = 0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&sync_boxes,(allocator_type *)&sig);
  sync_boxes.m_bat._0_8_ = 0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&sync_boxes,(allocator_type *)&rhcc);
  sync_boxes.m_bat._0_8_ = 0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&rhcc.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&sync_boxes,(allocator_type *)&rhnd_vec);
  sync_boxes.m_bat._0_8_ = 0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&rhnd_vec.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,10,
             (value_type *)&sync_boxes,(allocator_type *)&local_3b0);
  vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[c_lev] = Vsync;
  vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[level] = V_corr;
  sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[c_lev] = rho_crse;
  sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[level] = rho_fine;
  rhcc.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[c_lev] = cc_rhs_crse;
  rhcc.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[level] = cc_rhs_fine;
  rhnd_vec.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start[c_lev] = &rhnd;
  this_00 = (NavierStokesBase *)
            __dynamic_cast((this->LevelData).
                           super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[c_lev],
                           &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
  NavierStokesBase::average_down
            (this_00,vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[level],
             vel.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_start[c_lev],0,3);
  NavierStokesBase::average_down
            (this_00,sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[level],
             sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_start[c_lev],0,
             (sig.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start[c_lev]->super_FabArray<amrex::FArrayBox>).
             super_FabArrayBase.n_comp);
  if (crse_iteration != crse_dt_ratio || c_lev < 1) {
    local_430 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    iVar8 = amrex::AmrMesh::MaxRefRatio((AmrMesh *)this->parent,c_lev + -1);
    local_430 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    sync_boxes.m_bat._0_8_ = 1;
    sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
    sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
    local_3b0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_430,bxs,dm,1,iVar8 + -1,(MFInfo *)&sync_boxes,&local_3b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(local_430,0.0);
  }
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sync_boxes,&phi);
  crse_geom_00 = (Geometry *)&vel;
  doMLMGNodalProjection
            (this,c_lev,2,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)crse_geom_00,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sync_boxes,&sig,&rhcc
             ,&rhnd_vec,sync_tol,proj_abs_tol,true,(MultiFab *)0x0,(MultiFab *)local_430,false);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sync_boxes);
  iVar8 = extraout_EDX_02;
  if (crse_iteration == crse_dt_ratio && c_lev >= 1) {
    pGVar3 = (this->parent->super_AmrCore).super_AmrMesh.geom.
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    amrex::BoxArray::BoxArray(&sync_boxes,bxs_00);
    amrex::BoxArray::coarsen(&sync_boxes,ratio);
    crse_geom_00 = pGVar3 + (ulong)(uint)c_lev + 0xffffffffffffffff;
    SyncRegister::CompAdd
              (crsr_sync_reg,(MultiFab *)local_430,crse_geom,crse_geom_00,&sync_boxes,
               1.0 / (double)crse_iteration);
    amrex::BoxArray::~BoxArray(&sync_boxes);
    iVar8 = extraout_EDX_03;
  }
  rescaleVar(this,rho_crse,iVar8,(MultiFab *)crse_geom_00,c_lev);
  rescaleVar(this,rho_fine,extraout_EDX_04,(MultiFab *)crse_geom_00,level);
  amrex::MultiFab::Copy
            (phi_fine,phi.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,1);
  amrex::MultiFab::Add
            (pres_crse,
             phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[c_lev]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,
             (pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  amrex::MultiFab::Add
            (pres_fine,
             phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,
             (pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  amrex::MultiFab::Saxpy(vel_crse,dt_crse,Vsync,0,0,3,1);
  amrex::MultiFab::Saxpy(vel_fine,dt_crse,V_corr,0,0,3,1);
  if (verbose != 0) {
    dVar17 = amrex::ParallelDescriptor::second();
    poVar9 = amrex::OutStream();
    amrex::Print::Print((Print *)&sync_boxes,poVar9);
    poVar9 = (ostream *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1);
    std::operator<<(poVar9,"Projection::MLsyncProject(): levels = ");
    std::ostream::operator<<(poVar9,c_lev);
    std::operator<<(poVar9,", ");
    std::ostream::operator<<(poVar9,level);
    std::operator<<(poVar9,", time: ");
    std::ostream::_M_insert<double>(dVar17 - dVar16);
    std::operator<<(poVar9,'\n');
    amrex::Print::~Print((Print *)&sync_boxes);
  }
  if (local_430 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(local_430->super_FabArrayBase)._vptr_FabArrayBase[1])(local_430);
  }
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&rhnd_vec);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&rhcc);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sig);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&vel);
  amrex::MultiFab::~MultiFab(&rhnd);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           );
  return;
}

Assistant:

void
Projection::MLsyncProject (int             c_lev,
                           MultiFab&       pres_crse,
                           MultiFab&       vel_crse,
                           MultiFab&       cc_rhs_crse,
                           MultiFab&       pres_fine,
                           MultiFab&       vel_fine,
                           MultiFab&       cc_rhs_fine,
                           MultiFab&       rho_crse,
                           MultiFab&       rho_fine,
                           MultiFab&       Vsync,
                           MultiFab&       V_corr,
                           MultiFab&       phi_fine,
                           SyncRegister*   rhs_sync_reg,
                           SyncRegister*   crsr_sync_reg,
                           Real            dt_crse,
                           IntVect&        ratio,
                           int             crse_iteration,
                           int             crse_dt_ratio,
                           const Geometry& crse_geom)
{
    BL_PROFILE("Projection::MLsyncProject()");

    if (verbose) {
      amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev << ", " << c_lev+1 << '\n';
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    //
    // Set up memory.
    //
    Vector<std::unique_ptr<MultiFab> > phi(maxlev);

    const BoxArray& Pgrids_crse = pres_crse.boxArray();
    const BoxArray& Pgrids_fine = pres_fine.boxArray();
    const DistributionMapping& Pdmap_crse = pres_crse.DistributionMap();
    const DistributionMapping& Pdmap_fine = pres_fine.DistributionMap();

    phi[c_lev].reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,1,MFInfo(),LevelData[c_lev]->Factory()));
    phi[c_lev]->setVal(0);

    phi[c_lev+1].reset(new MultiFab(Pgrids_fine,Pdmap_fine,1,1,MFInfo(),LevelData[c_lev+1]->Factory()));
    phi[c_lev+1]->setVal(0);

    //
    // Set up crse RHS
    //
    MultiFab rhnd(Pgrids_crse,Pdmap_crse,1,0,MFInfo(),LevelData[c_lev]->Factory());
    rhs_sync_reg->InitRHS(rhnd,crse_geom,*phys_bc);

    Box P_finedomain(amrex::surroundingNodes(crse_geom.Domain()));
    P_finedomain.refine(ratio);
    if (Pgrids_fine[0] == P_finedomain) {
        rhnd.setVal(0);
    }
    //
    // Do necessary scaling
    //
    scaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    scaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    if (crse_geom.IsRZ()) {
       radMultScal(c_lev  ,cc_rhs_crse);
       radMultScal(c_lev+1,cc_rhs_fine);
    }

    Vector<MultiFab*> vel (maxlev, nullptr);
    Vector<MultiFab*> sig (maxlev, nullptr);
    Vector<MultiFab*> rhcc(maxlev, nullptr);
    Vector<MultiFab*> rhnd_vec(maxlev, nullptr);

    vel[c_lev  ] = &Vsync;
    vel[c_lev+1] = &V_corr;
    sig[c_lev  ] = &rho_crse;
    sig[c_lev+1] = &rho_fine;
    rhcc[c_lev  ] = &cc_rhs_crse;
    rhcc[c_lev+1] = &cc_rhs_fine;
    rhnd_vec[c_lev] = &rhnd;

    NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    ns->average_down(*vel[c_lev+1],*vel[c_lev],0,AMREX_SPACEDIM);

    ns->average_down(*sig[c_lev+1],*sig[c_lev],0,sig[c_lev]->nComp());

    MultiFab* sync_resid_crse = 0;
    std::unique_ptr<MultiFab> sync_resid_fine;

    if (c_lev > 0 &&  crse_iteration == crse_dt_ratio)
    {
        int ngrow = parent->MaxRefRatio(c_lev-1) - 1;
        sync_resid_fine.reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,ngrow));
        sync_resid_fine->setVal(0.);
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, 2, vel,
                          amrex::GetVecOfPtrs(phi),
                          sig, rhcc, rhnd_vec, sync_tol, proj_abs_tol, increment_gp,
                          sync_resid_crse, sync_resid_fine.get());

    //
    // If this sync project is not at levels 0-1 then we need to account for
    // the changes made here in the level c_lev velocity in the sync registers
    // going into the level (c_lev-1) sync project.  Note that this must be
    // done before rho_half is scaled back.
    //
    if (c_lev > 0 && crse_iteration == crse_dt_ratio)
    {
        const Real invrat         = 1.0/Real(crse_dt_ratio);
        const Geometry& crsr_geom = parent->Geom(c_lev-1);
        BoxArray sync_boxes       = pres_fine.boxArray();
        sync_boxes.coarsen(ratio);
        crsr_sync_reg->CompAdd(*sync_resid_fine,crse_geom,crsr_geom,sync_boxes,invrat);
    }
    //
    // Do necessary un-scaling.
    //
    rescaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    rescaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    MultiFab::Copy(phi_fine, *phi[c_lev+1], 0, 0, 1, 1);

    //
    // Add phi to pressure.
    // Only update the most recent pressure.
    //
    MultiFab::Add(pres_crse,*phi[c_lev],0,0,1,pres_crse.nGrow());
    MultiFab::Add(pres_fine,*phi[c_lev+1],0,0,1,pres_fine.nGrow());
    //
    // Grad(P_new) incremented in doMLMGNodalProjection
    //

    //
    // Add projected vel to new velocity.
    //
    MultiFab::Saxpy(vel_crse,dt_crse,Vsync,0,0,AMREX_SPACEDIM,1);
    MultiFab::Saxpy(vel_fine,dt_crse,V_corr,0,0,AMREX_SPACEDIM,1);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev
		       << ", " << c_lev+1 << ", time: " << run_time << '\n';
    }
}